

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

int gauden_compute(float64 **den,uint32 **den_idx,vector_t *obs,gauden_t *g,uint32 mgau,
                  uint32 **prev_den_idx)

{
  double dVar1;
  uint32 *local_90;
  uint local_48;
  uint local_44;
  uint32 k;
  uint32 j;
  uint32 **prev_den_idx_local;
  uint32 mgau_local;
  gauden_t *g_local;
  vector_t *obs_local;
  uint32 **den_idx_local;
  float64 **den_local;
  
  if (g->n_density < g->n_top) {
    __assert_fail("g->n_top <= g->n_density",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x479,
                  "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                 );
  }
  if (g->fullvar == (vector_t ****)0x0) {
    if (g->n_top == g->n_density) {
      for (local_44 = 0; local_44 < g->n_feat; local_44 = local_44 + 1) {
        log_full_densities(den[local_44],den_idx[local_44],g->n_density,g->veclen[local_44],
                           obs[local_44],g->mean[mgau][local_44],g->var[mgau][local_44],
                           g->norm[mgau][local_44]);
        for (local_48 = 0; local_48 < g->n_density; local_48 = local_48 + 1) {
          dVar1 = exp((double)den[local_44][local_48]);
          den[local_44][local_48] = (float64)dVar1;
        }
      }
    }
    else {
      if (g->n_density <= g->n_top) {
        __assert_fail("g->n_top < g->n_density",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x49e,
                      "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                     );
      }
      for (local_44 = 0; local_44 < g->n_feat; local_44 = local_44 + 1) {
        if (prev_den_idx == (uint32 **)0x0) {
          local_90 = (uint32 *)0x0;
        }
        else {
          local_90 = prev_den_idx[local_44];
        }
        log_topn_densities(den[local_44],den_idx[local_44],g->n_top,g->n_density,g->veclen[local_44]
                           ,obs[local_44],g->mean[mgau][local_44],g->var[mgau][local_44],
                           g->norm[mgau][local_44],local_90);
        for (local_48 = 0; local_48 < g->n_top; local_48 = local_48 + 1) {
          dVar1 = exp((double)den[local_44][local_48]);
          den[local_44][local_48] = (float64)dVar1;
        }
      }
    }
  }
  else {
    if (g->n_top != g->n_density) {
      __assert_fail("g->n_top == g->n_density",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x47d,
                    "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                   );
    }
    for (local_44 = 0; local_44 < g->n_feat; local_44 = local_44 + 1) {
      log_full_densities_full
                (den[local_44],den_idx[local_44],g->n_density,g->veclen[local_44],obs[local_44],
                 g->mean[mgau][local_44],g->fullvar[mgau][local_44],g->norm[mgau][local_44]);
      for (local_48 = 0; local_48 < g->n_density; local_48 = local_48 + 1) {
        dVar1 = exp((double)den[local_44][local_48]);
        den[local_44][local_48] = (float64)dVar1;
      }
    }
  }
  return 0;
}

Assistant:

int
gauden_compute(float64 **den,		/* density array for a mixture Gaussian */
	       uint32 **den_idx,	/* density index array for n_top < n_density eval */
	       vector_t *obs,		/* observation vector for some time */
	       gauden_t *g,		/* Gaussian density structure */
	       uint32 mgau,		/* id of the mixture Gau. to evaluate */
	       uint32 **prev_den_idx)   /* Previous frame's top N densities (or NULL) */
{
    uint32 j, k;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    /* Top-N computation not (yet) possible for full covariances */
    if (g->fullvar) {
	assert(g->n_top == g->n_density);
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities_full(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->fullvar[mgau][j],
			       g->norm[mgau][j]);

	    for (k = 0; k < g->n_density; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }
    else if (g->n_top == g->n_density) {
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j]);

	    for (k = 0; k < g->n_density; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }
    else {
	assert(g->n_top < g->n_density);

	for (j = 0; j < g->n_feat; j++) {
	    log_topn_densities(den[j],
			       den_idx[j],
			       g->n_top,
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j],
			       prev_den_idx ? prev_den_idx[j] : NULL);

	    for (k = 0; k < g->n_top; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }


#ifdef GAUDEN_VERBOSE
    gauden_print(stdout,
		 den, den_idx, g,
		 global_map, n_global_map);
#endif

    return S3_SUCCESS;
}